

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O3

void __thiscall
gutil::Properties::getValue<gmath::SMatrix<double,3,3>>
          (Properties *this,char *key,SMatrix<double,_3,_3> *value,char *defvalue)

{
  IOException *this_00;
  long *plVar1;
  size_type *psVar2;
  string v;
  istringstream in;
  allocator local_249;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  long local_1a8 [4];
  byte abStack_188 [88];
  ios_base local_130 [264];
  
  local_248._M_string_length = 0;
  local_248.field_2._M_local_buf[0] = '\0';
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  gutil::Properties::getString((char *)this,(string *)key,(char *)&local_248);
  std::__cxx11::istringstream::istringstream((istringstream *)local_1a8,(string *)&local_248,_S_in);
  gmath::operator>>((basic_istream<char,_std::char_traits<char>_> *)local_1a8,value);
  if ((abStack_188[*(long *)(local_1a8[0] + -0x18)] & 5) == 0) {
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1a8);
    std::ios_base::~ios_base(local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p);
    }
    return;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_208,key,&local_249);
  std::operator+(&local_1e8,"Format error: ",&local_208);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  local_228._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_228._M_dataplus._M_p == psVar2) {
    local_228.field_2._M_allocated_capacity = *psVar2;
    local_228.field_2._8_8_ = plVar1[3];
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  }
  else {
    local_228.field_2._M_allocated_capacity = *psVar2;
  }
  local_228._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::operator+(&local_1c8,&local_228,&local_248);
  IOException::IOException(this_00,&local_1c8);
  __cxa_throw(this_00,&IOException::typeinfo,Exception::~Exception);
}

Assistant:

void getValue(const char *key, T &value,
                                     const char *defvalue=0) const
    {
      std::string v;

      getString(key, v, defvalue);

      std::istringstream in(v);
      in >> value;

      if (in.fail())
      {
        throw IOException("Format error: "+std::string(key)+"="+v);
      }
    }